

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ppmd7.c
# Opt level: O0

void Ppmd7_Update1_0(CPpmd7 *p)

{
  byte bVar1;
  long *in_RDI;
  CPpmd7 *in_stack_00000040;
  
  *(uint *)(in_RDI + 4) =
       (uint)(*(ushort *)(*in_RDI + 2) < (ushort)((ushort)*(byte *)(in_RDI[2] + 1) * 2));
  *(int *)((long)in_RDI + 0x2c) = (int)in_RDI[4] + *(int *)((long)in_RDI + 0x2c);
  *(short *)(*in_RDI + 2) = *(short *)(*in_RDI + 2) + 4;
  bVar1 = *(char *)(in_RDI[2] + 1) + 4;
  *(byte *)(in_RDI[2] + 1) = bVar1;
  if (0x7c < bVar1) {
    Rescale(in_stack_00000040);
  }
  NextContext(p);
  return;
}

Assistant:

void Ppmd7_Update1_0(CPpmd7 *p)
{
  p->PrevSuccess = (2 * p->FoundState->Freq > p->MinContext->SummFreq);
  p->RunLength += p->PrevSuccess;
  p->MinContext->SummFreq += 4;
  if ((p->FoundState->Freq += 4) > MAX_FREQ)
    Rescale(p);
  NextContext(p);
}